

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::SetPackedFields(TestPackedTypesLite *message)

{
  TestPackedTypesLite *message_local;
  
  proto2_unittest::TestPackedTypesLite::add_packed_int32(message,0x259);
  proto2_unittest::TestPackedTypesLite::add_packed_int64(message,0x25a);
  proto2_unittest::TestPackedTypesLite::add_packed_uint32(message,0x25b);
  proto2_unittest::TestPackedTypesLite::add_packed_uint64(message,0x25c);
  proto2_unittest::TestPackedTypesLite::add_packed_sint32(message,0x25d);
  proto2_unittest::TestPackedTypesLite::add_packed_sint64(message,0x25e);
  proto2_unittest::TestPackedTypesLite::add_packed_fixed32(message,0x25f);
  proto2_unittest::TestPackedTypesLite::add_packed_fixed64(message,0x260);
  proto2_unittest::TestPackedTypesLite::add_packed_sfixed32(message,0x261);
  proto2_unittest::TestPackedTypesLite::add_packed_sfixed64(message,0x262);
  proto2_unittest::TestPackedTypesLite::add_packed_float(message,611.0);
  proto2_unittest::TestPackedTypesLite::add_packed_double(message,612.0);
  proto2_unittest::TestPackedTypesLite::add_packed_bool(message,true);
  proto2_unittest::TestPackedTypesLite::add_packed_enum(message,FOREIGN_LITE_BAR);
  proto2_unittest::TestPackedTypesLite::add_packed_int32(message,0x2bd);
  proto2_unittest::TestPackedTypesLite::add_packed_int64(message,0x2be);
  proto2_unittest::TestPackedTypesLite::add_packed_uint32(message,0x2bf);
  proto2_unittest::TestPackedTypesLite::add_packed_uint64(message,0x2c0);
  proto2_unittest::TestPackedTypesLite::add_packed_sint32(message,0x2c1);
  proto2_unittest::TestPackedTypesLite::add_packed_sint64(message,0x2c2);
  proto2_unittest::TestPackedTypesLite::add_packed_fixed32(message,0x2c3);
  proto2_unittest::TestPackedTypesLite::add_packed_fixed64(message,0x2c4);
  proto2_unittest::TestPackedTypesLite::add_packed_sfixed32(message,0x2c5);
  proto2_unittest::TestPackedTypesLite::add_packed_sfixed64(message,0x2c6);
  proto2_unittest::TestPackedTypesLite::add_packed_float(message,711.0);
  proto2_unittest::TestPackedTypesLite::add_packed_double(message,712.0);
  proto2_unittest::TestPackedTypesLite::add_packed_bool(message,false);
  proto2_unittest::TestPackedTypesLite::add_packed_enum(message,FOREIGN_LITE_BAZ);
  return;
}

Assistant:

void TestUtilLite::SetPackedFields(unittest::TestPackedTypesLite* message) {
  message->add_packed_int32(601);
  message->add_packed_int64(602);
  message->add_packed_uint32(603);
  message->add_packed_uint64(604);
  message->add_packed_sint32(605);
  message->add_packed_sint64(606);
  message->add_packed_fixed32(607);
  message->add_packed_fixed64(608);
  message->add_packed_sfixed32(609);
  message->add_packed_sfixed64(610);
  message->add_packed_float(611);
  message->add_packed_double(612);
  message->add_packed_bool(true);
  message->add_packed_enum(unittest::FOREIGN_LITE_BAR);
  // add a second one of each field
  message->add_packed_int32(701);
  message->add_packed_int64(702);
  message->add_packed_uint32(703);
  message->add_packed_uint64(704);
  message->add_packed_sint32(705);
  message->add_packed_sint64(706);
  message->add_packed_fixed32(707);
  message->add_packed_fixed64(708);
  message->add_packed_sfixed32(709);
  message->add_packed_sfixed64(710);
  message->add_packed_float(711);
  message->add_packed_double(712);
  message->add_packed_bool(false);
  message->add_packed_enum(unittest::FOREIGN_LITE_BAZ);
}